

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_drop.cpp
# Opt level: O2

BoundStatement * __thiscall
duckdb::Binder::Bind(BoundStatement *__return_storage_ptr__,Binder *this,DropStatement *stmt)

{
  byte bVar1;
  CatalogType catalog_type_p;
  ClientContext *pCVar2;
  _Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_> _Var3;
  undefined8 uVar4;
  int iVar5;
  StatementProperties *this_00;
  pointer pDVar6;
  pointer pDVar7;
  Catalog *pCVar8;
  CatalogEntry *pCVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CatalogException *this_01;
  BinderException *this_02;
  CatalogType type;
  unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true> *this_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<duckdb::LogicalType> __l_00;
  optional_ptr<duckdb::CatalogEntry,_true> entry;
  allocator local_b9;
  optional_ptr<duckdb::Catalog,_true> catalog;
  EntryLookupInfo entry_lookup;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->plan).
  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
       (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)0x0;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = GetStatementProperties(this);
  this_03 = &stmt->info;
  pDVar6 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                     (this_03);
  bVar1 = (pDVar6->super_ParseInfo).field_0x9;
  if (bVar1 < 0x20) {
    if ((0xc000015aU >> (bVar1 & 0x1f) & 1) != 0) {
      pDVar6 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                         (this_03);
      pDVar7 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                         (this_03);
      BindSchemaOrCatalog(this,&pDVar6->catalog,&pDVar7->schema);
      pCVar2 = this->context;
      pDVar6 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                         (this_03);
      catalog = Catalog::GetCatalogEntry(pCVar2,&pDVar6->catalog);
      if (catalog.ptr != (Catalog *)0x0) {
        pCVar8 = optional_ptr<duckdb::Catalog,_true>::operator*(&catalog);
        StatementProperties::RegisterDBRead(this_00,pCVar8,this->context);
      }
      pDVar6 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                         (this_03);
      catalog_type_p = (pDVar6->super_ParseInfo).field_0x9;
      pDVar6 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                         (this_03);
      EntryLookupInfo::EntryLookupInfo
                (&entry_lookup,catalog_type_p,&pDVar6->name,(QueryErrorContext)0xffffffffffffffff);
      pCVar2 = this->context;
      pDVar6 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                         (this_03);
      pDVar7 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                         (this_03);
      entry = Catalog::GetEntry(pCVar2,&pDVar6->catalog,&pDVar7->schema,&entry_lookup,RETURN_NULL);
      if (entry.ptr != (CatalogEntry *)0x0) {
        pCVar9 = optional_ptr<duckdb::CatalogEntry,_true>::operator->(&entry);
        if (pCVar9->internal == true) {
          this_01 = (CatalogException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_90,"Cannot drop internal catalog entry \"%s\"!",&local_b9);
          pCVar9 = optional_ptr<duckdb::CatalogEntry,_true>::operator->(&entry);
          ::std::__cxx11::string::string((string *)&local_50,(string *)&pCVar9->name);
          CatalogException::CatalogException<std::__cxx11::string>(this_01,&local_90,&local_50);
          __cxa_throw(this_01,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
        }
        pCVar9 = optional_ptr<duckdb::CatalogEntry,_true>::operator->(&entry);
        iVar5 = (*pCVar9->_vptr_CatalogEntry[0xb])(pCVar9);
        Catalog::GetName_abi_cxx11_((Catalog *)CONCAT44(extraout_var,iVar5));
        pDVar6 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::
                 operator->(this_03);
        ::std::__cxx11::string::_M_assign((string *)&pDVar6->catalog);
        pCVar9 = optional_ptr<duckdb::CatalogEntry,_true>::operator->(&entry);
        if (pCVar9->temporary == false) {
          pCVar9 = optional_ptr<duckdb::CatalogEntry,_true>::operator->(&entry);
          iVar5 = (*pCVar9->_vptr_CatalogEntry[0xb])(pCVar9);
          StatementProperties::RegisterDBModify
                    (this_00,(Catalog *)CONCAT44(extraout_var_00,iVar5),this->context);
        }
        pCVar9 = optional_ptr<duckdb::CatalogEntry,_true>::operator->(&entry);
        (*pCVar9->_vptr_CatalogEntry[0xd])(pCVar9);
        pDVar6 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::
                 operator->(this_03);
        ::std::__cxx11::string::_M_assign((string *)&pDVar6->schema);
      }
      goto LAB_012b8aff;
    }
    if (bVar1 == 2) {
      pCVar2 = this->context;
      pDVar6 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                         (this_03);
      pCVar8 = Catalog::GetCatalog(pCVar2,&pDVar6->catalog);
      StatementProperties::RegisterDBModify(this_00,pCVar8,this->context);
      goto LAB_012b8aff;
    }
    if (bVar1 != 5) goto LAB_012b8ac3;
  }
  else {
LAB_012b8ac3:
    if (bVar1 != 0x47) {
      this_02 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&entry_lookup,"Unknown catalog type for drop statement: \'%s\'",
                 (allocator *)&local_90);
      pDVar6 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                         (this_03);
      CatalogTypeToString_abi_cxx11_
                (&local_70,(duckdb *)(ulong)(byte)(pDVar6->super_ParseInfo).field_0x9,type);
      BinderException::BinderException<std::__cxx11::string>
                (this_02,(string *)&entry_lookup,&local_70);
      __cxa_throw(this_02,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  this_00->requires_valid_transaction = false;
LAB_012b8aff:
  local_90._M_dataplus._M_p._0_1_ = 0x84;
  make_uniq<duckdb::LogicalSimple,duckdb::LogicalOperatorType,duckdb::unique_ptr<duckdb::DropInfo,std::default_delete<duckdb::DropInfo>,true>>
            ((duckdb *)&entry_lookup,(LogicalOperatorType *)&local_90,this_03);
  uVar4 = entry_lookup._0_8_;
  entry_lookup.catalog_type = INVALID;
  entry_lookup._1_7_ = 0;
  _Var3.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
       (__return_storage_ptr__->plan).
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>;
  (__return_storage_ptr__->plan).
  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
       (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)uVar4;
  if (_Var3.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
      (LogicalOperator *)0x0) {
    (**(code **)(*(long *)_Var3.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl
                + 8))();
    if (entry_lookup._0_8_ != 0) {
      (**(code **)(*(long *)entry_lookup._0_8_ + 8))();
    }
  }
  ::std::__cxx11::string::string((string *)&entry_lookup,"Success",(allocator *)&catalog);
  __l._M_len = 1;
  __l._M_array = (iterator)&entry_lookup;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_90,__l,(allocator_type *)&entry);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__return_storage_ptr__->names,&local_90);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_90);
  ::std::__cxx11::string::~string((string *)&entry_lookup);
  LogicalType::LogicalType((LogicalType *)&local_90,BOOLEAN);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_90;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&entry_lookup,
             __l_00,(allocator_type *)&catalog);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::_M_move_assign
            (&(__return_storage_ptr__->types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,&entry_lookup)
  ;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&entry_lookup);
  LogicalType::~LogicalType((LogicalType *)&local_90);
  this_00->allow_stream_result = false;
  this_00->return_type = NOTHING;
  return __return_storage_ptr__;
}

Assistant:

BoundStatement Binder::Bind(DropStatement &stmt) {
	BoundStatement result;

	auto &properties = GetStatementProperties();
	switch (stmt.info->type) {
	case CatalogType::PREPARED_STATEMENT:
		// dropping prepared statements is always possible
		// it also does not require a valid transaction
		properties.requires_valid_transaction = false;
		break;
	case CatalogType::SCHEMA_ENTRY: {
		// dropping a schema is never read-only because there are no temporary schemas
		auto &catalog = Catalog::GetCatalog(context, stmt.info->catalog);
		properties.RegisterDBModify(catalog, context);
		break;
	}
	case CatalogType::VIEW_ENTRY:
	case CatalogType::SEQUENCE_ENTRY:
	case CatalogType::MACRO_ENTRY:
	case CatalogType::TABLE_MACRO_ENTRY:
	case CatalogType::INDEX_ENTRY:
	case CatalogType::TABLE_ENTRY:
	case CatalogType::TYPE_ENTRY: {
		BindSchemaOrCatalog(stmt.info->catalog, stmt.info->schema);
		auto catalog = Catalog::GetCatalogEntry(context, stmt.info->catalog);
		if (catalog) {
			// mark catalog as accessed
			properties.RegisterDBRead(*catalog, context);
		}
		EntryLookupInfo entry_lookup(stmt.info->type, stmt.info->name);
		auto entry = Catalog::GetEntry(context, stmt.info->catalog, stmt.info->schema, entry_lookup,
		                               OnEntryNotFound::RETURN_NULL);
		if (!entry) {
			break;
		}
		if (entry->internal) {
			throw CatalogException("Cannot drop internal catalog entry \"%s\"!", entry->name);
		}
		stmt.info->catalog = entry->ParentCatalog().GetName();
		if (!entry->temporary) {
			// we can only drop temporary schema entries in read-only mode
			properties.RegisterDBModify(entry->ParentCatalog(), context);
		}
		stmt.info->schema = entry->ParentSchema().name;
		break;
	}
	case CatalogType::SECRET_ENTRY: {
		//! Secrets are stored in the secret manager; they can always be dropped
		properties.requires_valid_transaction = false;
		break;
	}
	default:
		throw BinderException("Unknown catalog type for drop statement: '%s'", CatalogTypeToString(stmt.info->type));
	}
	result.plan = make_uniq<LogicalSimple>(LogicalOperatorType::LOGICAL_DROP, std::move(stmt.info));
	result.names = {"Success"};
	result.types = {LogicalType::BOOLEAN};

	properties.allow_stream_result = false;
	properties.return_type = StatementReturnType::NOTHING;
	return result;
}